

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_lib.cc
# Opt level: O3

void * X509V3_get_d2i(stack_st_X509_EXTENSION *x,int nid,int *crit,int *idx)

{
  X509_EXTENSION *pXVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  X509_EXTENSION *ex;
  void *pvVar5;
  X509_EXTENSION *pXVar6;
  size_t i;
  
  if (x != (stack_st_X509_EXTENSION *)0x0) {
    i = 0;
    uVar2 = 0;
    if (idx != (int *)0x0) {
      uVar2 = *idx + 1;
    }
    if (0 < (int)uVar2) {
      i = (size_t)uVar2;
    }
    sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)x);
    if (i < sVar4) {
      pXVar6 = (X509_EXTENSION *)0x0;
      do {
        ex = (X509_EXTENSION *)OPENSSL_sk_value((OPENSSL_STACK *)x,i);
        iVar3 = OBJ_obj2nid(ex->object);
        pXVar1 = pXVar6;
        if (iVar3 == nid) {
          if (idx != (int *)0x0) {
            *idx = (int)i;
            goto LAB_00221c9a;
          }
          pXVar1 = ex;
          if (pXVar6 != (X509_EXTENSION *)0x0) {
            if (crit == (int *)0x0) {
              return (void *)0x0;
            }
            *crit = -2;
            return (void *)0x0;
          }
        }
        ex = pXVar1;
        i = i + 1;
        sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)x);
        pXVar6 = ex;
      } while (i < sVar4);
      if (ex != (X509_EXTENSION *)0x0) {
LAB_00221c9a:
        if (crit != (int *)0x0) {
          iVar3 = X509_EXTENSION_get_critical(ex);
          *crit = iVar3;
        }
        pvVar5 = X509V3_EXT_d2i(ex);
        return pvVar5;
      }
    }
  }
  if (idx != (int *)0x0) {
    *idx = -1;
  }
  if (crit != (int *)0x0) {
    *crit = -1;
  }
  return (void *)0x0;
}

Assistant:

void *X509V3_get_d2i(const STACK_OF(X509_EXTENSION) *extensions, int nid,
                     int *out_critical, int *out_idx) {
  int lastpos;
  X509_EXTENSION *ex, *found_ex = NULL;
  if (!extensions) {
    if (out_idx) {
      *out_idx = -1;
    }
    if (out_critical) {
      *out_critical = -1;
    }
    return NULL;
  }
  if (out_idx) {
    lastpos = *out_idx + 1;
  } else {
    lastpos = 0;
  }
  if (lastpos < 0) {
    lastpos = 0;
  }
  for (size_t i = lastpos; i < sk_X509_EXTENSION_num(extensions); i++) {
    ex = sk_X509_EXTENSION_value(extensions, i);
    if (OBJ_obj2nid(ex->object) == nid) {
      if (out_idx) {
        // TODO(https://crbug.com/boringssl/379): Consistently reject
        // duplicate extensions.
        *out_idx = (int)i;
        found_ex = ex;
        break;
      } else if (found_ex) {
        // Found more than one
        if (out_critical) {
          *out_critical = -2;
        }
        return NULL;
      }
      found_ex = ex;
    }
  }
  if (found_ex) {
    // Found it
    if (out_critical) {
      *out_critical = X509_EXTENSION_get_critical(found_ex);
    }
    return X509V3_EXT_d2i(found_ex);
  }

  // Extension not found
  if (out_idx) {
    *out_idx = -1;
  }
  if (out_critical) {
    *out_critical = -1;
  }
  return NULL;
}